

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void close_state(lua_State *L)

{
  byte bVar1;
  uint uVar2;
  global_State *g_00;
  char *pcVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  uint local_90;
  MSize segnum;
  global_State *g;
  lua_State *L_local;
  
  g_00 = (global_State *)(L->glref).ptr64;
  lj_func_closeuv(L,(TValue *)(L->stack).ptr64);
  lj_gc_freeall(g_00);
  lj_trace_freestate(g_00);
  lj_ctype_freestate(g_00);
  uVar6 = (ulong)((g_00->str).mask + 1);
  (g_00->gc).total = (g_00->gc).total + uVar6 * -8;
  (*g_00->allocf)(g_00->allocd,(g_00->str).tab,uVar6 * 8,0);
  pcVar3 = (g_00->tmpbuf).b;
  uVar6 = (ulong)(uint)((int)(g_00->tmpbuf).e - (int)(g_00->tmpbuf).b);
  (g_00->gc).total = (g_00->gc).total - uVar6;
  (*g_00->allocf)(g_00->allocd,pcVar3,uVar6,0);
  pvVar4 = (void *)(L->stack).ptr64;
  uVar2 = L->stacksize;
  (g_00->gc).total = (g_00->gc).total + (ulong)uVar2 * -8;
  (*g_00->allocf)(g_00->allocd,pvVar4,(ulong)uVar2 * 8,0);
  if ((g_00->gc).lightudseg.ptr64 != 0) {
    if ((g_00->gc).lightudnum == '\0') {
      local_90 = 2;
    }
    else {
      bVar1 = (g_00->gc).lightudnum;
      iVar5 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      local_90 = 2 << ((byte)iVar5 & 0x1f);
    }
    pvVar4 = (void *)(g_00->gc).lightudseg.ptr64;
    (g_00->gc).total = (g_00->gc).total + (ulong)local_90 * -4;
    (*g_00->allocf)(g_00->allocd,pvVar4,(ulong)local_90 * 4,0);
  }
  if (g_00->allocf == lj_alloc_f) {
    lj_alloc_destroy(g_00->allocd);
  }
  else {
    (*g_00->allocf)(g_00->allocd,g_00[-1].gcroot + 0x1a,0x1860,0);
  }
  return;
}

Assistant:

static void close_state(lua_State *L)
{
  global_State *g = G(L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_freeall(g);
  lj_assertG(gcref(g->gc.root) == obj2gco(L),
	     "main thread is not first GC object");
  lj_assertG(g->str.num == 0, "leaked %d strings", g->str.num);
  lj_trace_freestate(g);
#if LJ_HASFFI
  lj_ctype_freestate(g);
#endif
  lj_str_freetab(g);
  lj_buf_free(g, &g->tmpbuf);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
#if LJ_64
  if (mref(g->gc.lightudseg, uint32_t)) {
    MSize segnum = g->gc.lightudnum ? (2 << lj_fls(g->gc.lightudnum)) : 2;
    lj_mem_freevec(g, mref(g->gc.lightudseg, uint32_t), segnum, uint32_t);
  }
#endif
  lj_assertG(g->gc.total == sizeof(GG_State),
	     "memory leak of %lld bytes",
	     (long long)(g->gc.total - sizeof(GG_State)));
#ifndef LUAJIT_USE_SYSMALLOC
  if (g->allocf == lj_alloc_f)
    lj_alloc_destroy(g->allocd);
  else
#endif
    g->allocf(g->allocd, G2GG(g), sizeof(GG_State), 0);
}